

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmutex.cpp
# Opt level: O2

void __thiscall QBasicMutex::destroyInternal(QBasicMutex *this,void *ptr)

{
  long in_FS_OFFSET;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (ptr != (void *)0x0) {
    local_28.context.version = 2;
    local_28.context.function._4_4_ = 0;
    local_28.context._4_8_ = 0;
    local_28.context._12_8_ = 0;
    local_28.context.category = "default";
    QMessageLogger::warning(&local_28,"QMutex: destroying locked mutex");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBasicMutex::destroyInternal(void *ptr)
{
    auto d = static_cast<QMutexPrivate *>(ptr);
    if (!d)
        return;
    if (!futexAvailable()) {
        if (d != dummyLocked() && d->possiblyUnlocked.loadRelaxed() && tryLock()) {
            unlock();
            return;
        }
    }
    qWarning("QMutex: destroying locked mutex");
}